

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void process_player_input_fire(tgestate_t *state,input_t input)

{
  undefined4 in_ESI;
  tgestate_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 9:
  default:
    break;
  case 10:
    pick_up_item(unaff_retaddr);
    break;
  case 0xb:
    drop_item(unaff_retaddr);
    break;
  case 0xc:
    use_item_common((tgestate_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),'\0');
    break;
  case 0xf:
    use_item_common((tgestate_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),'\0');
  }
  return;
}

Assistant:

void process_player_input_fire(tgestate_t *state, input_t input)
{
  assert(state != NULL);

  switch (input)
  {
  case input_UP_FIRE:
    pick_up_item(state);
    break;
  case input_DOWN_FIRE:
    drop_item(state);
    break;
  case input_LEFT_FIRE:
    use_item_common(state, state->items_held[0]); /* Conv: Inlined. */
    break;
  case input_RIGHT_FIRE:
    use_item_common(state, state->items_held[1]); /* Conv: Inlined. */
    break;
  case input_FIRE:
  default:
    break;
  }

  return;
}